

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O2

VmValue * CompileVmDoWhile(ExpressionContext *ctx,VmModule *module,ExprDoWhile *node)

{
  VmBlock *block;
  VmBlock *block_00;
  VmBlock *block_01;
  VmValue *pVVar1;
  LoopInfo local_40;
  
  block = anon_unknown.dwarf_f89de::CreateBlock(module,(node->super_ExprBase).source,"do_body");
  block_00 = anon_unknown.dwarf_f89de::CreateBlock(module,(node->super_ExprBase).source,"do_cond");
  block_01 = anon_unknown.dwarf_f89de::CreateBlock(module,(node->super_ExprBase).source,"do_exit");
  anon_unknown.dwarf_f89de::CreateJump(module,(node->super_ExprBase).source,&block->super_VmValue);
  VmFunction::AddBlock(module->currentFunction,block);
  module->currentBlock = block;
  local_40.breakBlock = block_01;
  local_40.continueBlock = block_00;
  SmallArray<VmModule::LoopInfo,_32U>::push_back(&module->loopInfo,&local_40);
  CompileVm(ctx,module,node->body);
  anon_unknown.dwarf_f89de::CreateJump
            (module,(node->super_ExprBase).source,&block_00->super_VmValue);
  VmFunction::AddBlock(module->currentFunction,block_00);
  module->currentBlock = block_00;
  pVVar1 = CompileVm(ctx,module,node->condition);
  anon_unknown.dwarf_f89de::CreateJumpNotZero
            (module,(node->super_ExprBase).source,pVVar1,&block->super_VmValue,
             &block_01->super_VmValue);
  VmFunction::AddBlock(module->currentFunction,block_01);
  module->currentBlock = block_01;
  SmallArray<VmModule::LoopInfo,_32U>::pop_back(&module->loopInfo);
  pVVar1 = anon_unknown.dwarf_f89de::CreateVoid(module);
  anon_unknown.dwarf_f89de::CheckType(ctx,&node->super_ExprBase,pVVar1);
  return pVVar1;
}

Assistant:

VmValue* CompileVmDoWhile(ExpressionContext &ctx, VmModule *module, ExprDoWhile *node)
{
	VmBlock *bodyBlock = CreateBlock(module, node->source, "do_body");
	VmBlock *condBlock = CreateBlock(module, node->source, "do_cond");
	VmBlock *exitBlock = CreateBlock(module, node->source, "do_exit");

	CreateJump(module, node->source, bodyBlock);

	module->currentFunction->AddBlock(bodyBlock);
	module->currentBlock = bodyBlock;

	module->loopInfo.push_back(VmModule::LoopInfo(exitBlock, condBlock));

	CompileVm(ctx, module, node->body);

	CreateJump(module, node->source, condBlock);

	module->currentFunction->AddBlock(condBlock);
	module->currentBlock = condBlock;

	VmValue* condition = CompileVm(ctx, module, node->condition);

	CreateJumpNotZero(module, node->source, condition, bodyBlock, exitBlock);

	module->currentFunction->AddBlock(exitBlock);
	module->currentBlock = exitBlock;

	module->loopInfo.pop_back();

	return CheckType(ctx, node, CreateVoid(module));
}